

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::PointsISA::vbounds(BBox3fa *__return_storage_ptr__,PointsISA *this,size_t i)

{
  undefined1 auVar1 [16];
  long lVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  long lVar5;
  undefined1 auVar6 [16];
  
  lVar2 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
  lVar5 = i * *(long *)&(this->super_Points).field_0x68;
  auVar1 = *(undefined1 (*) [16])(lVar2 + lVar5);
  fVar3 = *(float *)(lVar2 + 0xc + lVar5) * (this->super_Points).maxRadiusScale;
  auVar6._4_4_ = fVar3;
  auVar6._0_4_ = fVar3;
  auVar6._8_4_ = fVar3;
  auVar6._12_4_ = fVar3;
  aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar1,auVar6);
  (__return_storage_ptr__->lower).field_0 = aVar4;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar1._0_4_ + fVar3;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar1._4_4_ + fVar3;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar1._8_4_ + fVar3;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar1._12_4_ + fVar3;
  return __return_storage_ptr__;
}

Assistant:

__forceinline const T& operator [](size_t i) const { assert(i<num); return *(T*)(ptr_ofs + i*stride); }